

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O0

void test_receive_ping_frame(void)

{
  cio_error cVar1;
  undefined1 local_58 [4];
  cio_error err;
  ws_frame frames [2];
  undefined4 local_d;
  undefined1 local_9;
  char data [5];
  
  local_d = 0x61616161;
  local_9 = 0;
  local_58 = (undefined1  [4])0x9;
  err = CIO_SUCCESS;
  frames[0]._0_8_ = &local_d;
  frames[0].data = (void *)0x5;
  frames[0].data_length._0_1_ = 1;
  frames[0].data_length._1_1_ = 0;
  frames[0].last_frame = true;
  frames[0].rsv = false;
  frames[0]._26_2_ = 0;
  frames[0]._28_4_ = 0;
  frames[1].frame_type = CIO_WEBSOCKET_CONTINUATION_FRAME;
  frames[1].direction = FROM_CLIENT;
  frames[1].data = (void *)0x0;
  frames[1].data_length._0_1_ = 1;
  frames[1].data_length._1_1_ = 0;
  serialize_frames((ws_frame *)local_58,2);
  *(ushort *)&(ws->ws_private).ws_flags =
       *(ushort *)&(ws->ws_private).ws_flags & 0xfbff | (ushort)(err == CIO_SUCCESS) << 10;
  cVar1 = cio_websocket_read_message(ws,read_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar1,"Could not start reading a message!",0x525,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)read_handler_fake.call_count,"read_handler was not called",0x527,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)read_handler_fake.arg0_val,
             "websocket parameter of read_handler not correct",0x528,UNITY_DISPLAY_STYLE_HEX64);
  if (read_handler_fake.arg1_val != (void *)0x0) {
    UnityFail("context parameter of read_handler not correct",0x529);
  }
  UnityAssertEqualNumber
            (1,(long)read_handler_fake.arg2_val,"error parameter of read_handler not correct",0x52a,
             UNITY_DISPLAY_STYLE_INT);
  if (read_handler_fake.arg4_val != (uint8_t *)0x0) {
    UnityFail("data parameter of read_handler not correct",0x52b);
  }
  UnityAssertEqualNumber
            (0,read_handler_fake.arg5_val,"length parameter of read_handler not correct",0x52c,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(ulong)on_error_fake.call_count,"error callback was called",0x52e,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (2,(ulong)on_control_fake.call_count,
             "on_control callback was not called twice (for ping and close)",0x530,
             UNITY_DISPLAY_STYLE_INT);
  if (on_control_fake.arg0_history[0] == (cio_websocket *)0x0) {
    UnityFail("websocket parameter of control callback (ping) is NULL",0x531);
  }
  UnityAssertEqualNumber
            (9,(ulong)on_control_fake.arg1_history[0],
             "type parameter of control callback (ping) is not PING",0x532,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (5,(ulong)on_control_fake.arg3_history[0],
             "data length parameter of control callback (ping) is not correct",0x533,
             UNITY_DISPLAY_STYLE_INT);
  if (on_control_fake.arg0_history[1] != (cio_websocket *)0x0) {
    UnityAssertEqualNumber
              (8,(ulong)on_control_fake.arg1_history[1],
               "type parameter of control callback (close) is not CLOSE",0x536,
               UNITY_DISPLAY_STYLE_INT);
    if (on_control_fake.arg2_history[1] == (uint8_t *)0x0) {
      UnityAssertEqualNumber
                (0,(ulong)on_control_fake.arg3_history[1],
                 "data length parameter of control callback (close) is not correct",0x538,
                 UNITY_DISPLAY_STYLE_INT);
      UnityAssertEqualMemory
                (&local_d,read_back_buffer,5,1,"data in ping frame callback not correct",0x53a,
                 UNITY_ARRAY_TO_ARRAY);
      return;
    }
    UnityFail("data parameter of control callback (close) is not NULL",0x537);
  }
  UnityFail("websocket parameter of control callback (close) is NULL",0x535);
}

Assistant:

static void test_receive_ping_frame(void)
{
	char data[] = "aaaa";

	struct ws_frame frames[] = {
	    {.frame_type = CIO_WEBSOCKET_PING_FRAME, .direction = FROM_CLIENT, .data = data, .data_length = sizeof(data), .last_frame = true, .rsv = false},
	    {.frame_type = CIO_WEBSOCKET_CLOSE_FRAME, .direction = FROM_CLIENT, .data = NULL, .data_length = 0, .last_frame = true, .rsv = false},
	};

	serialize_frames(frames, ARRAY_SIZE(frames));

	ws->ws_private.ws_flags.is_server = (frames[0].direction == FROM_CLIENT) ? 1 : 0;
	enum cio_error err = cio_websocket_read_message(ws, read_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Could not start reading a message!");

	TEST_ASSERT_EQUAL_MESSAGE(1, read_handler_fake.call_count, "read_handler was not called");
	TEST_ASSERT_EQUAL_PTR_MESSAGE(ws, read_handler_fake.arg0_val, "websocket parameter of read_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(read_handler_fake.arg1_val, "context parameter of read_handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_EOF, read_handler_fake.arg2_val, "error parameter of read_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(read_handler_fake.arg4_val, "data parameter of read_handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(0, read_handler_fake.arg5_val, "length parameter of read_handler not correct");

	TEST_ASSERT_EQUAL_MESSAGE(0, on_error_fake.call_count, "error callback was called");

	TEST_ASSERT_EQUAL_MESSAGE(2, on_control_fake.call_count, "on_control callback was not called twice (for ping and close)");
	TEST_ASSERT_NOT_NULL_MESSAGE(on_control_fake.arg0_history[0], "websocket parameter of control callback (ping) is NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_WEBSOCKET_PING_FRAME, on_control_fake.arg1_history[0], "type parameter of control callback (ping) is not PING");
	TEST_ASSERT_EQUAL_MESSAGE(sizeof(data), on_control_fake.arg3_history[0], "data length parameter of control callback (ping) is not correct");

	TEST_ASSERT_NOT_NULL_MESSAGE(on_control_fake.arg0_history[1], "websocket parameter of control callback (close) is NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_WEBSOCKET_CLOSE_FRAME, on_control_fake.arg1_history[1], "type parameter of control callback (close) is not CLOSE");
	TEST_ASSERT_NULL_MESSAGE(on_control_fake.arg2_history[1], "data parameter of control callback (close) is not NULL");
	TEST_ASSERT_EQUAL_MESSAGE(0, on_control_fake.arg3_history[1], "data length parameter of control callback (close) is not correct");

	TEST_ASSERT_EQUAL_MEMORY_MESSAGE(data, read_back_buffer, sizeof(data), "data in ping frame callback not correct");
}